

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

int yaml_parser_update_raw_buffer(yaml_parser_t *parser)

{
  int iVar1;
  long local_20;
  size_t size_read;
  yaml_parser_t *parser_local;
  
  local_20 = 0;
  if (((parser->raw_buffer).start == (parser->raw_buffer).pointer) &&
     ((parser->raw_buffer).last == (parser->raw_buffer).end)) {
    parser_local._4_4_ = 1;
  }
  else if (parser->eof == 0) {
    size_read = (size_t)parser;
    if (((parser->raw_buffer).start < (parser->raw_buffer).pointer) &&
       ((parser->raw_buffer).pointer < (parser->raw_buffer).last)) {
      memmove((parser->raw_buffer).start,(parser->raw_buffer).pointer,
              (long)(parser->raw_buffer).last - (long)(parser->raw_buffer).pointer);
    }
    *(long *)(size_read + 200) =
         *(long *)(size_read + 200) - (*(long *)(size_read + 0xc0) - *(long *)(size_read + 0xb0));
    *(undefined8 *)(size_read + 0xc0) = *(undefined8 *)(size_read + 0xb0);
    iVar1 = (**(code **)(size_read + 0x58))
                      (*(undefined8 *)(size_read + 0x60),*(undefined8 *)(size_read + 200),
                       *(long *)(size_read + 0xb8) - *(long *)(size_read + 200),&local_20);
    if (iVar1 == 0) {
      parser_local._4_4_ =
           yaml_parser_set_reader_error
                     ((yaml_parser_t *)size_read,"input error",*(size_t *)(size_read + 0xd8),-1);
    }
    else {
      *(long *)(size_read + 200) = local_20 + *(long *)(size_read + 200);
      if (local_20 == 0) {
        *(undefined4 *)(size_read + 0x80) = 1;
      }
      parser_local._4_4_ = 1;
    }
  }
  else {
    parser_local._4_4_ = 1;
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_update_raw_buffer(yaml_parser_t *parser)
{
    size_t size_read = 0;

    /* Return if the raw buffer is full. */

    if (parser->raw_buffer.start == parser->raw_buffer.pointer
            && parser->raw_buffer.last == parser->raw_buffer.end)
        return 1;

    /* Return on EOF. */

    if (parser->eof) return 1;

    /* Move the remaining bytes in the raw buffer to the beginning. */

    if (parser->raw_buffer.start < parser->raw_buffer.pointer
            && parser->raw_buffer.pointer < parser->raw_buffer.last) {
        memmove(parser->raw_buffer.start, parser->raw_buffer.pointer,
                parser->raw_buffer.last - parser->raw_buffer.pointer);
    }
    parser->raw_buffer.last -=
        parser->raw_buffer.pointer - parser->raw_buffer.start;
    parser->raw_buffer.pointer = parser->raw_buffer.start;

    /* Call the read handler to fill the buffer. */

    if (!parser->read_handler(parser->read_handler_data, parser->raw_buffer.last,
                parser->raw_buffer.end - parser->raw_buffer.last, &size_read)) {
        return yaml_parser_set_reader_error(parser, "input error",
                parser->offset, -1);
    }
    parser->raw_buffer.last += size_read;
    if (!size_read) {
        parser->eof = 1;
    }

    return 1;
}